

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall randomx::Instruction::h_IADD_RS(Instruction *this,ostream *os)

{
  byte bVar1;
  ostream *poVar2;
  uint uVar3;
  
  uVar3 = this->dst & 7;
  bVar1 = this->src;
  poVar2 = std::operator<<(os,"r");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar3);
  poVar2 = std::operator<<(poVar2,", r");
  std::ostream::operator<<(poVar2,bVar1 & 7);
  if (uVar3 == 5) {
    poVar2 = std::operator<<(os,", ");
    std::ostream::operator<<(poVar2,this->imm32);
  }
  poVar2 = std::operator<<(os,", SHFT ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->mod >> 2 & 3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Instruction::h_IADD_RS(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		os << "r" << dstIndex << ", r" << srcIndex;
		if(dstIndex == RegisterNeedsDisplacement) {
			os << ", " << (int32_t)getImm32();
		}
		os << ", SHFT " << getModShift() << std::endl;
	}